

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

int Aig_ManCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar3;
  int local_24;
  int nNodesOld;
  int i;
  Aig_Obj_t *pNode;
  Vec_Ptr_t *vObjs;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManNodeNum(p);
  p_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) &&
       (iVar2 = Aig_ObjRefs(pAVar3), iVar2 == 0)) {
      Vec_PtrPush(p_00,pAVar3);
    }
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(p_00), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24);
    Aig_ObjDelete_rec(p,pAVar3,1);
  }
  Vec_PtrFree(p_00);
  iVar2 = Aig_ManNodeNum(p);
  return iVar1 - iVar2;
}

Assistant:

int Aig_ManCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pNode;
    int i, nNodesOld = Aig_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Aig_ManForEachObj( p, pNode, i )
        if ( Aig_ObjIsNode(pNode) && Aig_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pNode, i )
        Aig_ObjDelete_rec( p, pNode, 1 );
    Vec_PtrFree( vObjs );
    return nNodesOld - Aig_ManNodeNum(p);
}